

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdCheck1Step(void *p,word *pTruth,int nVarsInit,int *pVarLevels)

{
  int nWords_00;
  int iVar1;
  int iVar2;
  int local_2b8 [2];
  int pVarLevels_1 [12];
  int nSumCofs;
  int nSumCofsBest;
  int vBest;
  int i;
  int nSizeNonDec1;
  int nSizeNonDec0;
  int nSizeNonDec;
  int nWords;
  int pVarPrios [12];
  word pCofTemp [64];
  int *pVarLevels_local;
  int nVarsInit_local;
  word *pTruth_local;
  void *p_local;
  
  nWords_00 = Abc_TtWordNum(nVarsInit);
  nSumCofs = -2;
  pVarLevels_1[0xb] = 1000000000;
  iVar1 = Dau_DsdDecompose(pTruth,nVarsInit,0,0,(char *)0x0);
  if (iVar1 == 0) {
    p_local._4_4_ = -1;
  }
  else {
    if (iVar1 < 1) {
      __assert_fail("nSizeNonDec > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x387,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
    }
    for (nSumCofsBest = 0; nSumCofsBest < nVarsInit; nSumCofsBest = nSumCofsBest + 1) {
      (&nSizeNonDec)[nSumCofsBest] = nSumCofsBest;
    }
    if (pVarLevels != (int *)0x0) {
      for (nSumCofsBest = 0; nSumCofsBest < nVarsInit; nSumCofsBest = nSumCofsBest + 1) {
        iVar1 = Dau_DsdLevelVar(p,nSumCofsBest);
        pVarLevels_1[(long)nSumCofsBest + -2] = -iVar1;
      }
      Vec_IntSelectSortCost2(&nSizeNonDec,nVarsInit,local_2b8);
    }
    for (nSumCofsBest = 0; nSumCofsBest < nVarsInit; nSumCofsBest = nSumCofsBest + 1) {
      if (((&nSizeNonDec)[nSumCofsBest] < 0) || (nVarsInit <= (&nSizeNonDec)[nSumCofsBest])) {
        __assert_fail("pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0x39b,"int Dau_DsdCheck1Step(void *, word *, int, int *)");
      }
      Abc_TtCofactor0p((word *)(pVarPrios + 10),pTruth,nWords_00,(&nSizeNonDec)[nSumCofsBest]);
      pVarLevels_1[10] = Abc_TtSupportSize((word *)(pVarPrios + 10),nVarsInit);
      iVar1 = Dau_DsdDecompose((word *)(pVarPrios + 10),nVarsInit,0,0,(char *)0x0);
      Abc_TtCofactor1p((word *)(pVarPrios + 10),pTruth,nWords_00,(&nSizeNonDec)[nSumCofsBest]);
      iVar2 = Abc_TtSupportSize((word *)(pVarPrios + 10),nVarsInit);
      pVarLevels_1[10] = iVar2 + pVarLevels_1[10];
      iVar2 = Dau_DsdDecompose((word *)(pVarPrios + 10),nVarsInit,0,0,(char *)0x0);
      if (((iVar1 == 0) && (iVar2 == 0)) && (pVarLevels_1[10] < pVarLevels_1[0xb])) {
        nSumCofs = (&nSizeNonDec)[nSumCofsBest];
        pVarLevels_1[0xb] = pVarLevels_1[10];
      }
    }
    p_local._4_4_ = nSumCofs;
  }
  return p_local._4_4_;
}

Assistant:

int Dau_DsdCheck1Step( void * p, word * pTruth, int nVarsInit, int * pVarLevels )
{
    word pCofTemp[DAU_MAX_WORD];
    int pVarPrios[DAU_MAX_VAR];
    int nWords = Abc_TtWordNum(nVarsInit);
    int nSizeNonDec, nSizeNonDec0, nSizeNonDec1;
    int i, vBest = -2, nSumCofsBest = ABC_INFINITY, nSumCofs;
    nSizeNonDec = Dau_DsdDecompose( pTruth, nVarsInit, 0, 0, NULL );
    if ( nSizeNonDec == 0 )
        return -1;
    assert( nSizeNonDec > 0 );
    // find variable priority
    for ( i = 0; i < nVarsInit; i++ )
        pVarPrios[i] = i;
    if ( pVarLevels )
    {
        extern int Dau_DsdLevelVar( void * pMan, int iVar );
        int pVarLevels[DAU_MAX_VAR];
        for ( i = 0; i < nVarsInit; i++ )
            pVarLevels[i] = -Dau_DsdLevelVar( p, i );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", -pVarLevels[i] );
//        printf( "\n" );
        Vec_IntSelectSortCost2( pVarPrios, nVarsInit, pVarLevels );
//        for ( i = 0; i < nVarsInit; i++ )
//            printf( "%d ", pVarPrios[i] );
//        printf( "\n\n" );
    }
    for ( i = 0; i < nVarsInit; i++ )
    {
        assert( pVarPrios[i] >= 0 && pVarPrios[i] < nVarsInit );
        // try first cofactor
        Abc_TtCofactor0p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs = Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec0 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // try second cofactor
        Abc_TtCofactor1p( pCofTemp, pTruth, nWords, pVarPrios[i] );
        nSumCofs += Abc_TtSupportSize( pCofTemp, nVarsInit );
        nSizeNonDec1 = Dau_DsdDecompose( pCofTemp, nVarsInit, 0, 0, NULL );
        // compare cofactors
        if ( nSizeNonDec0 || nSizeNonDec1 )
            continue;
        if ( nSumCofsBest > nSumCofs )
        {
            vBest = pVarPrios[i];
            nSumCofsBest = nSumCofs;
        }
    }
    return vBest;
}